

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool AddLocal(CService *addr_,int nScore)

{
  string_view logging_function;
  bool bVar1;
  undefined1 uVar2;
  uint16_t uVar3;
  GlobalMutex *mutexIn;
  type_conflict3 *ptVar4;
  pointer ppVar5;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  LocalServiceInfo *info;
  type *is_newly_added;
  type *it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  int *in_stack_00000078;
  UniqueLock<GlobalMutex> criticalblock19;
  CService addr;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CNetAddr *in_stack_fffffffffffffec0;
  ReachableNets *in_stack_fffffffffffffec8;
  LocalServiceInfo *__args_1;
  char *in_stack_fffffffffffffed0;
  CService *__args;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  CService *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  LogFlags in_stack_ffffffffffffff20;
  int source_line;
  bool local_b1;
  ConstevalFormatString<2U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff80 [12];
  LocalServiceInfo local_50 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeFlipIPv6toCJDNS(in_stack_fffffffffffffef0);
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)in_stack_fffffffffffffec8);
  if (bVar1) {
    if (((fDiscover & 1U) == 0) && ((int)in_ESI < 4)) {
      local_b1 = false;
    }
    else {
      uVar2 = ReachableNets::Contains(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if ((bool)uVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
        source_line = 0;
        CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffffef0);
        __args = (CService *)&stack0xffffffffffffff8c;
        __args_1 = local_50;
        in_stack_fffffffffffffeb8 = 2;
        logging_function._M_str._4_4_ = in_ESI;
        logging_function._0_12_ = in_stack_ffffffffffffff80;
        LogPrintFormatInternal<std::__cxx11::string,int>
                  (logging_function,in_stack_ffffffffffffff70,source_line,in_stack_ffffffffffffff20,
                   (Level)is_newly_added,in_stack_ffffffffffffff68,in_stack_00000070,
                   in_stack_00000078);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        mutexIn = MaybeCheckNotHeld<GlobalMutex>
                            ((GlobalMutex *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        UniqueLock<GlobalMutex>::UniqueLock
                  ((UniqueLock<GlobalMutex> *)CONCAT17(uVar2,in_stack_fffffffffffffef8),mutexIn,
                   in_stack_fffffffffffffee8,
                   (char *)CONCAT17(in_stack_fffffffffffffee7,
                                    CONCAT16(in_stack_fffffffffffffee6,
                                             CONCAT24(in_stack_fffffffffffffee4,
                                                      in_stack_fffffffffffffee0))),
                   in_stack_fffffffffffffedc,SUB41((uint)in_stack_fffffffffffffed8 >> 0x18,0));
        std::
        map<CNetAddr,LocalServiceInfo,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
        ::emplace<CService&,LocalServiceInfo>
                  ((map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
                    *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__args,__args_1)
        ;
        std::get<0ul,std::_Rb_tree_iterator<std::pair<CNetAddr_const,LocalServiceInfo>>,bool>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool>
                    *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        ptVar4 = std::
                 get<1ul,std::_Rb_tree_iterator<std::pair<CNetAddr_const,LocalServiceInfo>>,bool>
                           ((pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool>
                             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        if (((*ptVar4 & 1U) != 0) || ((ppVar5->second).nScore <= (int)in_ESI)) {
          (ppVar5->second).nScore = in_ESI + ((byte)~*ptVar4 & 1);
          uVar3 = CService::GetPort((CService *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          (ppVar5->second).nPort = uVar3;
        }
        UniqueLock<GlobalMutex>::~UniqueLock
                  ((UniqueLock<GlobalMutex> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_b1 = true;
      }
      else {
        local_b1 = false;
      }
    }
  }
  else {
    local_b1 = false;
  }
  CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}